

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::paintEvent(Picker *this,QPaintEvent *param_1)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QPalette *this_00;
  QColor *baseColor;
  int iVar6;
  PickerPrivate *pPVar7;
  int local_b4;
  QPainter p;
  QModelIndex local_a0;
  QModelIndex local_88;
  QStyleOption opt;
  QRect local_60 [3];
  
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  this_00 = (QPalette *)QWidget::palette();
  baseColor = QPalette::color(this_00,Dark);
  drawCylinder(&p,local_60,baseColor,true,true);
  iVar3 = count(this);
  if (0 < iVar3) {
    cVar2 = QPersistentModelIndex::isValid();
    pPVar7 = (this->d).d;
    if (cVar2 == '\0') {
      pQVar1 = pPVar7->model;
      iVar3 = pPVar7->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar7->root);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_88,pQVar1,0,iVar3,&local_a0);
      QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&local_88);
      pPVar7 = (this->d).d;
      pPVar7->drawItemOffset = 0;
    }
    PickerPrivate::initDrawOffsetForFirstUse(pPVar7);
    PickerPrivate::normalizeOffset((this->d).d);
    iVar3 = ((this->d).d)->itemsCount;
    iVar4 = count(this);
    pPVar7 = (this->d).d;
    local_b4 = pPVar7->drawItemOffset;
    iVar6 = pPVar7->itemsCount;
    iVar5 = QPersistentModelIndex::row();
    iVar3 = iVar3 + (uint)(iVar6 <= iVar4);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (iVar6 = 0; iVar3 != iVar6; iVar6 = iVar6 + 1) {
      iVar4 = count(this);
      if (iVar4 <= iVar6) break;
      iVar4 = count(this);
      if (iVar5 == iVar4) {
        iVar5 = 0;
      }
      pPVar7 = (this->d).d;
      pQVar1 = pPVar7->model;
      iVar4 = pPVar7->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar7->root);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_88,pQVar1,iVar5,iVar4,&local_a0);
      PickerPrivate::drawItem(pPVar7,&p,&opt,local_b4,&local_88);
      pPVar7 = (this->d).d;
      local_b4 = local_b4 + pPVar7->itemTopMargin + pPVar7->stringHeight;
      iVar5 = iVar5 + 1;
    }
  }
  QPainter::~QPainter(&p);
  QStyleOption::~QStyleOption(&opt);
  return;
}

Assistant:

void
Picker::paintEvent( QPaintEvent * )
{
	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	drawCylinder( &p, opt.rect, palette().color( QPalette::Dark ) );

	if( count() > 0 )
	{
		if( !d->topItemIndex.isValid() )
		{
			d->topItemIndex = d->model->index( 0, d->modelColumn, d->root );
			d->drawItemOffset = 0;
		}

		d->initDrawOffsetForFirstUse();
		d->normalizeOffset();

		int maxCount = d->itemsCount;

		if( count() >= d->itemsCount )
			++maxCount;

		int offset = d->drawItemOffset;

		for( int i = d->topItemIndex.row(), itemsCount = 0, scanedItems = 0;
			( itemsCount < maxCount ) && ( scanedItems < count() ) ;
			++i, ++scanedItems, ++itemsCount )
		{
			if( i == count() )
				i = 0;

			d->drawItem( &p, opt, offset,
				d->model->index( i, d->modelColumn, d->root ) );

			offset += d->itemTopMargin + d->stringHeight;
		}
	}
}